

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

bool __thiscall cmCTestBZR::UpdateParser::ProcessChunk(UpdateParser *this,char *first,int length)

{
  string *psVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  
  bVar4 = *first == '\n' || *first == '\r';
  psVar1 = &(this->super_LineParser).Line;
  for (lVar7 = 0; length != lVar7; lVar7 = lVar7 + 1) {
    if ((first[lVar7] == '\r') || (first[lVar7] == '\n')) {
      bVar3 = !bVar4;
      bVar4 = true;
      if (bVar3) {
        poVar6 = (this->super_LineParser).Log;
        if ((poVar6 != (ostream *)0x0) &&
           (pcVar2 = (this->super_LineParser).Prefix, pcVar2 != (char *)0x0)) {
          poVar6 = std::operator<<(poVar6,pcVar2);
          poVar6 = std::operator<<(poVar6,(string *)psVar1);
          std::operator<<(poVar6,"\n");
        }
        iVar5 = (*(this->super_LineParser).super_OutputParser._vptr_OutputParser[3])(this);
        (this->super_LineParser).Line._M_string_length = 0;
        *(this->super_LineParser).Line._M_dataplus._M_p = '\0';
        if ((char)iVar5 == '\0') break;
      }
    }
    else {
      std::__cxx11::string::append((ulong)psVar1,'\x01');
      bVar4 = false;
    }
  }
  return length == lVar7;
}

Assistant:

bool ProcessChunk(const char* first, int length) override
  {
    bool last_is_new_line = (*first == '\r' || *first == '\n');

    const char* const last = first + length;
    for (const char* c = first; c != last; ++c) {
      if (*c == '\r' || *c == '\n') {
        if (!last_is_new_line) {
          // Log this line.
          if (this->Log && this->Prefix) {
            *this->Log << this->Prefix << this->Line << "\n";
          }

          // Hand this line to the subclass implementation.
          if (!this->ProcessLine()) {
            this->Line.clear();
            return false;
          }

          this->Line.clear();
          last_is_new_line = true;
        }
      } else {
        // Append this character to the line under construction.
        this->Line.append(1, *c);
        last_is_new_line = false;
      }
    }
    return true;
  }